

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::SolveDirect
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *B,DecomposeType dt,list<long,_std::allocator<long>_> *singular)

{
  if ((this->fFront).super_TPZFront<double>.fDecomposeType != dt) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.cpp"
               ,0x142);
  }
  (*(this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
  (*(this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x45])(this,B);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
    if (fFront.GetDecomposeType() != dt) {
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        
        std::stringstream sout;
        B.Print("On input " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Forward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("After forward and diagonal " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Backward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("Final result " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    return 1;
}